

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Parser::_start_map_unk(Parser *this,bool as_child)

{
  char *pcVar1;
  size_t sVar2;
  csubstr ka;
  
  if (this->m_key_anchor_was_before == false) {
    pcVar1 = (this->m_key_anchor).str;
    sVar2 = (this->m_key_anchor).len;
    (this->m_key_anchor).str = (char *)0x0;
    (this->m_key_anchor).len = 0;
    _start_map(this,as_child);
    (this->m_key_anchor).str = pcVar1;
    (this->m_key_anchor).len = sVar2;
  }
  else {
    _start_map(this,as_child);
    this->m_key_anchor_was_before = false;
  }
  if (((this->m_key_tag2).len != 0) && ((this->m_key_tag2).str != (char *)0x0)) {
    sVar2 = (this->m_key_tag2).len;
    (this->m_key_tag).str = (this->m_key_tag2).str;
    (this->m_key_tag).len = sVar2;
    this->m_key_tag_indentation = this->m_key_tag2_indentation;
    (this->m_key_tag2).str = (char *)0x0;
    (this->m_key_tag2).len = 0;
    this->m_key_tag2_indentation = 0;
  }
  return;
}

Assistant:

void Parser::_start_map_unk(bool as_child)
{
    if(!m_key_anchor_was_before)
    {
        _c4dbgpf("stash key anchor before starting map... '{}'", m_key_anchor);
        csubstr ka = m_key_anchor;
        m_key_anchor = {};
        _start_map(as_child);
        m_key_anchor = ka;
    }
    else
    {
        _start_map(as_child);
        m_key_anchor_was_before = false;
    }
    if(m_key_tag2.not_empty())
    {
        m_key_tag = m_key_tag2;
        m_key_tag_indentation = m_key_tag2_indentation;
        m_key_tag2.clear();
        m_key_tag2_indentation = 0;
    }
}